

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    iVar4 = (int)uVar5;
    uVar3 = 0xff;
    if (0xff < iVar4) {
      uVar3 = uVar5;
    }
    uVar6 = iVar4 - 1;
    lVar2 = (long)iVar4;
    do {
      if (0xfe < lVar2) {
        uVar6 = (uint)uVar3;
        break;
      }
      uVar6 = uVar6 + 1;
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (this->bytemap_[lVar1] == this->bytemap_[iVar4]);
    StringAppendF(__return_storage_ptr__,"[%02x-%02x] -> %d\n",uVar5,(ulong)uVar6);
    uVar5 = (ulong)(uVar6 + 1);
    if (0xfe < (int)uVar6) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string Prog::DumpByteMap() {
  string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    StringAppendF(&map, "[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}